

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_NodeDeref_rec(Gia_Man_t *p,Gia_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  
  uVar1 = (uint)*(undefined8 *)pNode;
  iVar2 = 0;
  if ((~uVar1 & 0x9fffffff) != 0) {
    if (((int)uVar1 < 0) || ((uVar1 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                    ,0x428,"int Gia_NodeDeref_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar4 = pNode + -(ulong)(uVar1 & 0x1fffffff);
    iVar2 = Gia_ObjRefNum(p,pGVar4);
    if (iVar2 < 1) {
      __assert_fail("Gia_ObjRefNum(p, pFanin) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                    ,0x42a,"int Gia_NodeDeref_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar3 = Gia_ObjRefDec(p,pGVar4);
    iVar2 = 0;
    if (iVar3 == 0) {
      iVar2 = Gia_NodeDeref_rec(p,pGVar4);
    }
    pGVar4 = pNode + -(ulong)(*(uint *)&pNode->field_0x4 & 0x1fffffff);
    iVar3 = Gia_ObjRefNum(p,pGVar4);
    if (iVar3 < 1) {
      __assert_fail("Gia_ObjRefNum(p, pFanin) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                    ,0x42e,"int Gia_NodeDeref_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar3 = Gia_ObjRefDec(p,pGVar4);
    if (iVar3 == 0) {
      iVar3 = Gia_NodeDeref_rec(p,pGVar4);
      iVar2 = iVar2 + iVar3;
    }
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int Gia_NodeDeref_rec( Gia_Man_t * p, Gia_Obj_t * pNode )
{
    Gia_Obj_t * pFanin;
    int Counter = 0;
    if ( Gia_ObjIsCi(pNode) )
        return 0;
    assert( Gia_ObjIsAnd(pNode) );
    pFanin = Gia_ObjFanin0(pNode);
    assert( Gia_ObjRefNum(p, pFanin) > 0 );
    if ( Gia_ObjRefDec(p, pFanin) == 0 )
        Counter += Gia_NodeDeref_rec( p, pFanin );
    pFanin = Gia_ObjFanin1(pNode);
    assert( Gia_ObjRefNum(p, pFanin) > 0 );
    if ( Gia_ObjRefDec(p, pFanin) == 0 )
        Counter += Gia_NodeDeref_rec( p, pFanin );
    return Counter + 1;
}